

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O3

void __thiscall
CHeap::updateheap_unsafe(CHeap *this,AbstractSearchState *AbstractSearchState,CKey *NewKey)

{
  heapelement *phVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = (long)AbstractSearchState->heapindex;
  if (lVar3 == 0) {
    heaperror("updateheap: AbstractSearchState is not in heap");
  }
  phVar1 = this->heap;
  lVar2 = NewKey->key[1];
  if ((phVar1[lVar3].key.key[0] == NewKey->key[0]) && (phVar1[lVar3].key.key[1] == lVar2)) {
    return;
  }
  phVar1[lVar3].key.key[0] = NewKey->key[0];
  phVar1[lVar3].key.key[1] = lVar2;
  return;
}

Assistant:

void CHeap::updateheap_unsafe(AbstractSearchState* AbstractSearchState, CKey NewKey)
{
    if (AbstractSearchState->heapindex == 0) {
        heaperror("updateheap: AbstractSearchState is not in heap");
    }
    if (heap[AbstractSearchState->heapindex].key != NewKey) {
        heap[AbstractSearchState->heapindex].key = NewKey;
    }
}